

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_device(nng_socket s1,nng_socket s2)

{
  nng_err nVar1;
  undefined1 local_1d8 [4];
  int rv;
  nni_aio aio;
  nng_socket s2_local;
  nng_socket s1_local;
  
  aio.a_reap_node.rn_next._0_4_ = s2.id;
  aio.a_reap_node.rn_next._4_4_ = s1.id;
  nni_aio_init((nni_aio *)local_1d8,(nni_cb)0x0,(void *)0x0);
  nng_device_aio((nng_aio *)local_1d8,aio.a_reap_node.rn_next._4_4_,aio.a_reap_node.rn_next._0_4_);
  nni_aio_wait((nni_aio *)local_1d8);
  nVar1 = nni_aio_result((nni_aio *)local_1d8);
  nni_aio_fini((nni_aio *)local_1d8);
  return nVar1;
}

Assistant:

int
nng_device(nng_socket s1, nng_socket s2)
{
	nni_aio aio;
	int     rv;
	nni_aio_init(&aio, NULL, NULL);
	nng_device_aio(&aio, s1, s2);
	nni_aio_wait(&aio);
	rv = nni_aio_result(&aio);
	nni_aio_fini(&aio);
	return (rv);
}